

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paper_example_put_array.c
# Opt level: O0

void put_array(int *xs,int n)

{
  uint uVar1;
  int iVar2;
  int n_over_p;
  int p;
  int dst_idx;
  int dst_pid;
  int i;
  int n_local;
  int *xs_local;
  
  uVar1 = bsp_nprocs();
  iVar2 = n / (int)uVar1;
  if (n % (int)uVar1 != 0) {
    bsp_abort("{put_array} n=%d not divisible by p=%d\n",(ulong)(uint)n,(ulong)uVar1);
  }
  bsp_push_reg(xs,iVar2 << 2);
  bsp_sync();
  for (dst_idx = 0; dst_idx < iVar2; dst_idx = dst_idx + 1) {
    bsp_put(xs[dst_idx] / iVar2,xs + dst_idx,xs,xs[dst_idx] % iVar2 << 2,4);
  }
  bsp_sync();
  bsp_pop_reg(xs);
  return;
}

Assistant:

void put_array( int * xs, int n ) {
    int i, dst_pid, dst_idx;
    int p = bsp_nprocs();
    int n_over_p = n/p;

    if ((n%p) != 0)
        bsp_abort("{put_array} n=%d not divisible by p=%d\n", n, p);
    bsp_push_reg( xs, n_over_p*sizeof(xs[0]));
    bsp_sync();

    for (i = 0; i < n_over_p; ++i) {
        dst_pid = xs[i] / n_over_p;
        dst_idx = xs[i] % n_over_p;
        bsp_put( dst_pid, &xs[i], xs, dst_idx*sizeof(xs[0]), sizeof(xs[0]));
    }
    bsp_sync();
    bsp_pop_reg(xs);
}